

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fct.h
# Opt level: O1

void fct_clp__final(fct_clp_t *clp)

{
  size_t sVar1;
  
  fct_nlist__final(&clp->clo_list,fctcl__del);
  if ((clp->param_list).used_itm_num != 0) {
    sVar1 = 0;
    do {
      free((clp->param_list).itm_list[sVar1]);
      sVar1 = sVar1 + 1;
    } while (sVar1 != (clp->param_list).used_itm_num);
  }
  (clp->param_list).used_itm_num = 0;
  free((clp->param_list).itm_list);
  return;
}

Assistant:

static void
fct_clp__final(fct_clp_t *clp)
{
    fct_nlist__final(&(clp->clo_list), (fct_nlist_on_del_t)fctcl__del);
    fct_nlist__final(&(clp->param_list), (fct_nlist_on_del_t)free);
}